

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubcommandTable.cxx
# Opt level: O0

void __thiscall
cmSubcommandTable::cmSubcommandTable
          (cmSubcommandTable *this,
          initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
          init)

{
  const_iterator __first;
  const_iterator __last;
  iterator iVar1;
  iterator iVar2;
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  local_21;
  cmSubcommandTable *local_20;
  cmSubcommandTable *this_local;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init_local;
  
  init_local._M_array = (iterator)init._M_len;
  this_local = (cmSubcommandTable *)init._M_array;
  local_20 = this;
  __first = std::
            initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
            ::begin((initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
                     *)&this_local);
  __last = std::
           initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
           ::end((initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
                  *)&this_local);
  std::
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  ::allocator(&local_21);
  std::
  vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>
  ::
  vector<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>const*,void>
            ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>
              *)this,__first,__last,&local_21);
  std::
  allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  ::~allocator(&local_21);
  iVar1 = std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
          ::begin(&this->Impl);
  iVar2 = std::
          vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
          ::end(&this->Impl);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>*,std::vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>>>,cmSubcommandTable::cmSubcommandTable(std::initializer_list<std::pair<cm::static_string_view,bool(*)(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)>>)::__0>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

cmSubcommandTable::cmSubcommandTable(std::initializer_list<InitElem> init)
  : Impl(init.begin(), init.end())
{
  std::sort(this->Impl.begin(), this->Impl.end(),
            [](Elem const& left, Elem const& right) {
              return left.first < right.first;
            });
}